

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O2

size_t __thiscall
flatbuffers::VerifierTemplate<false>::VerifyOffset<unsigned_int,int>
          (VerifierTemplate<false> *this,size_t start)

{
  bool bVar1;
  size_t sVar2;
  
  bVar1 = Verify<unsigned_int>(this,start);
  if ((bVar1) && (sVar2 = (size_t)*(int *)(this->buf_ + start), 0 < (long)sVar2)) {
    if (this->size_ - 1 < start + sVar2) {
      sVar2 = 0;
    }
    if (this->size_ < 2) {
      sVar2 = 0;
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t VerifyOffset(const size_t start) const {
    if (!Verify<OffsetT>(start)) return 0;
    const auto o = ReadScalar<OffsetT>(buf_ + start);
    // May not point to itself.
    if (!Check(o != 0)) return 0;
    // Can't wrap around larger than the max size.
    if (!Check(static_cast<SOffsetT>(o) >= 0)) return 0;
    // Must be inside the buffer to create a pointer from it (pointer outside
    // buffer is UB).
    if (!Verify(start + o, 1)) return 0;
    return o;
  }